

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FindHelper<false,false>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  RecyclableObject *this;
  undefined4 *puVar7;
  uint64 uVar8;
  uint64 uVar9;
  JavascriptMethod p_Var10;
  char16_t *varName;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_50;
  Var element;
  RecyclableObject *local_40;
  ScriptContext *local_38;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  element = typedArrayBase;
  local_40 = obj;
  local_38 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9663f:
    varName = L"[TypedArray].prototype.find";
    if (element == (Var)0x0) {
      varName = L"Array.prototype.find";
    }
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec34,varName);
  }
  pvVar6 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar4) goto LAB_00b9663f;
  pvVar6 = Arguments::operator[](args,1);
  this = VarTo<Js::RecyclableObject>(pvVar6);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && element == (Var)0x0) {
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(local_40);
    if (bVar4) {
      element = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(local_40);
    }
    else {
      element = (Var)0x0;
    }
LAB_00b9608a:
    local_50 = (RecyclableObject *)0x0;
    if (element == (Var)0x0) {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_50 = (RecyclableObject *)
                 FindObjectHelper<false,false>
                           (local_40,length,0,this,(Var)jsReentLock._24_8_,local_38);
      goto LAB_00b96619;
    }
    if (length < 0x100000000) {
      if (length < 1) goto LAB_00b9657b;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) {
LAB_00b96664:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    local_40 = (RecyclableObject *)__tls_get_addr(&PTR_01548f08);
    uVar14 = 0;
    do {
      local_50 = (RecyclableObject *)(**(code **)(*element + 0x390))(element,uVar14);
      if ((int)uVar14 < 0) {
        dVar3 = (double)uVar14;
        uVar8 = NumberUtilities::ToSpecial(dVar3);
        bVar4 = NumberUtilities::IsNan(dVar3);
        if (((bVar4) && (uVar9 = NumberUtilities::ToSpecial(dVar3), uVar9 != 0xfff8000000000000)) &&
           (uVar9 = NumberUtilities::ToSpecial(dVar3), uVar9 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar4) goto LAB_00b96664;
          *(undefined4 *)
           &(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        uVar12 = uVar8 ^ 0xfffc000000000000;
      }
      else {
        uVar12 = uVar14 | 0x1000000000000;
      }
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pTVar1 = local_38->threadContext;
      bVar4 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
      if (local_38->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var10 = RecyclableObject::GetEntryPoint(this);
      CheckIsExecutable(this,p_Var10);
      p_Var10 = RecyclableObject::GetEntryPoint(this);
      pvVar6 = (*p_Var10)(this,(CallInfo)this,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_,
                          local_50,uVar12,element);
      pTVar1->reentrancySafeOrHandled = bVar4;
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
      *(bool *)((long)local_80 + 0x108) = true;
      BVar5 = JavascriptConversion::ToBoolean(pvVar6,local_38);
      if (BVar5 != 0) goto LAB_00b96619;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 < (ulong)length);
  }
  else {
    local_50 = (RecyclableObject *)0x0;
    if (pArr == (JavascriptArray *)0x0) goto LAB_00b9608a;
    element = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
              .undefinedValue.ptr;
    if (length < 0x100000000) {
      if (0 < length) goto LAB_00b96359;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) goto LAB_00b96664;
      *puVar7 = 0;
LAB_00b96359:
      uVar13 = 1;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar14 = 0;
      do {
        uVar11 = uVar13 - 1;
        local_50 = (RecyclableObject *)element;
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                  (pArr,(ulong)uVar11,&local_50);
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if ((int)uVar11 < 0) {
          dVar3 = (double)uVar11;
          uVar8 = NumberUtilities::ToSpecial(dVar3);
          bVar4 = NumberUtilities::IsNan(dVar3);
          if (((bVar4) && (uVar9 = NumberUtilities::ToSpecial(dVar3), uVar9 != 0xfff8000000000000))
             && (uVar9 = NumberUtilities::ToSpecial(dVar3), uVar9 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar4) goto LAB_00b96664;
            *puVar7 = 0;
          }
          uVar14 = uVar8 ^ 0xfffc000000000000;
        }
        else {
          uVar14 = uVar14 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar1 = local_38->threadContext;
        bVar4 = pTVar1->reentrancySafeOrHandled;
        pTVar1->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
        if (local_38->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var10 = RecyclableObject::GetEntryPoint(this);
        CheckIsExecutable(this,p_Var10);
        p_Var10 = RecyclableObject::GetEntryPoint(this);
        pvVar6 = (*p_Var10)(this,(CallInfo)this,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_,
                            local_50,uVar14,pArr);
        pTVar1->reentrancySafeOrHandled = bVar4;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        BVar5 = JavascriptConversion::ToBoolean(pvVar6,local_38);
        if (BVar5 != 0) goto LAB_00b96619;
        bVar4 = IsNonES5Array(local_40);
        if (!bVar4) {
          bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_40);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2141,"(VarIs<ES5Array>(obj))",
                                        "The array should have been converted to an ES5Array");
            if (!bVar4) goto LAB_00b96664;
            *puVar7 = 0;
          }
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_50 = (RecyclableObject *)
                     FindObjectHelper<false,false>
                               (local_40,length,(ulong)uVar13,this,(Var)jsReentLock._24_8_,local_38)
          ;
          goto LAB_00b96619;
        }
        uVar14 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 < (ulong)length);
    }
  }
LAB_00b9657b:
  local_50 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
LAB_00b96619:
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_50;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }